

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget.cpp
# Opt level: O3

void __thiscall QGraphicsWidget::unsetWindowFrameMargins(QGraphicsWidget *this)

{
  uint uVar1;
  QGraphicsWidgetPrivate *this_00;
  double dVar2;
  qreal qVar3;
  QMarginsF margins;
  int iVar4;
  QStyle *pQVar5;
  long in_FS_OFFSET;
  QStyleOptionTitleBar bar;
  undefined1 local_98 [8];
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  QPalettePrivate *pQStack_70;
  undefined1 *local_68;
  QObject *pQStack_60;
  undefined1 *local_58;
  QArrayData *pQStack_50;
  char16_t *local_48;
  undefined1 *puStack_40;
  QIcon local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsWidgetPrivate **)(this + 0x18);
  uVar1 = (this_00->windowFlags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
          super_QFlagsStorage<Qt::WindowType>.i;
  if ((((uVar1 & 1) == 0) || ((byte)((byte)uVar1 | 4) == 0xd)) || ((uVar1 >> 0xb & 1) != 0)) {
    local_88 = (undefined1 *)0x0;
    puStack_80 = (undefined1 *)0x0;
    local_98 = (undefined1  [8])0x0;
    puStack_90 = (undefined1 *)0x0;
    setWindowFrameMargins(this,(QMarginsF)ZEXT1632(ZEXT816(0)));
  }
  else {
    local_38.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_50 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_60 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_70 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_98 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOptionTitleBar::QStyleOptionTitleBar((QStyleOptionTitleBar *)local_98);
    QGraphicsWidgetPrivate::initStyleOptionTitleBar(this_00,(QStyleOptionTitleBar *)local_98);
    pQVar5 = style(this);
    iVar4 = (**(code **)(*(long *)pQVar5 + 0xe0))(pQVar5,0x2c,(QStyleOptionTitleBar *)local_98,0);
    dVar2 = (double)iVar4;
    qVar3 = QGraphicsWidgetPrivate::titleBarHeight(this_00,(QStyleOptionTitleBar *)local_98);
    margins.m_top = qVar3;
    margins.m_left = dVar2;
    margins.m_right = dVar2;
    margins.m_bottom = dVar2;
    setWindowFrameMargins(this,margins);
    QIcon::~QIcon(&local_38);
    if (pQStack_50 != (QArrayData *)0x0) {
      LOCK();
      (pQStack_50->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQStack_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQStack_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQStack_50,2,0x10);
      }
    }
    QStyleOption::~QStyleOption((QStyleOption *)local_98);
  }
  this_00->setWindowFrameMargins = false;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsWidget::unsetWindowFrameMargins()
{
    Q_D(QGraphicsWidget);
    if ((d->windowFlags & Qt::Window) && (d->windowFlags & Qt::WindowType_Mask) != Qt::Popup &&
         (d->windowFlags & Qt::WindowType_Mask) != Qt::ToolTip && !(d->windowFlags & Qt::FramelessWindowHint)) {
        QStyleOptionTitleBar bar;
        d->initStyleOptionTitleBar(&bar);
        QStyle *style = this->style();
        const qreal margin = style->pixelMetric(QStyle::PM_MdiSubWindowFrameWidth, &bar);
        qreal titleBarHeight  = d->titleBarHeight(bar);
        setWindowFrameMargins(margin, titleBarHeight, margin, margin);
    } else {
        setWindowFrameMargins(0, 0, 0, 0);
    }
    d->setWindowFrameMargins = false;
}